

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StopPositionRequest.h
# Opt level: O2

void __thiscall
io::aeron::archive::codecs::StopPositionRequest::reset
          (StopPositionRequest *this,char *buffer,uint64_t offset,uint64_t bufferLength,
          uint64_t actingBlockLength,uint64_t actingVersion)

{
  this->m_buffer = buffer;
  this->m_offset = offset;
  this->m_bufferLength = bufferLength;
  this->m_actingBlockLength = actingBlockLength;
  this->m_actingVersion = actingVersion;
  this->m_positionPtr = &this->m_position;
  sbePosition(this,actingBlockLength + offset);
  return;
}

Assistant:

inline void reset(
        char *buffer, const std::uint64_t offset, const std::uint64_t bufferLength,
        const std::uint64_t actingBlockLength, const std::uint64_t actingVersion)
    {
        m_buffer = buffer;
        m_offset = offset;
        m_bufferLength = bufferLength;
        m_actingBlockLength = actingBlockLength;
        m_actingVersion = actingVersion;
        m_positionPtr = &m_position;
        sbePosition(offset + m_actingBlockLength);
    }